

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O1

Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT> *
wasm::WATParser::absheaptype<wasm::WATParser::ParseModuleTypesCtx>
          (Result<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
           *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Shareability share)

{
  undefined8 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  long lVar4;
  Lexer *this;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string local_68;
  Err local_48;
  
  this = &ctx->in;
  expected._M_str = "func";
  expected._M_len = 4;
  bVar3 = Lexer::takeKeyword(this,expected);
  if (bVar3) {
    lVar4 = (ulong)(share == Shared) * 4 + 0x10;
  }
  else {
    expected_00._M_str = "any";
    expected_00._M_len = 3;
    bVar3 = Lexer::takeKeyword(this,expected_00);
    if (bVar3) {
      lVar4 = (ulong)(share == Shared) * 4 + 0x20;
    }
    else {
      expected_01._M_str = "extern";
      expected_01._M_len = 6;
      bVar3 = Lexer::takeKeyword(this,expected_01);
      if (bVar3) {
        lVar4 = (ulong)(share == Shared) * 4 + 8;
      }
      else {
        expected_02._M_str = "eq";
        expected_02._M_len = 2;
        bVar3 = Lexer::takeKeyword(this,expected_02);
        if (bVar3) {
          lVar4 = (ulong)(share == Shared) * 4 + 0x28;
        }
        else {
          expected_03._M_str = "i31";
          expected_03._M_len = 3;
          bVar3 = Lexer::takeKeyword(this,expected_03);
          if (bVar3) {
            lVar4 = (ulong)(share == Shared) * 4 + 0x30;
          }
          else {
            expected_04._M_str = "struct";
            expected_04._M_len = 6;
            bVar3 = Lexer::takeKeyword(this,expected_04);
            if (bVar3) {
              lVar4 = (ulong)(share == Shared) * 4 + 0x38;
            }
            else {
              expected_05._M_str = "array";
              expected_05._M_len = 5;
              bVar3 = Lexer::takeKeyword(this,expected_05);
              if (bVar3) {
                lVar4 = (ulong)(share == Shared) * 4 + 0x40;
              }
              else {
                expected_06._M_str = "exn";
                expected_06._M_len = 3;
                bVar3 = Lexer::takeKeyword(this,expected_06);
                if (bVar3) {
                  lVar4 = (ulong)(share == Shared) * 4 + 0x48;
                }
                else {
                  expected_07._M_str = "string";
                  expected_07._M_len = 6;
                  bVar3 = Lexer::takeKeyword(this,expected_07);
                  if (bVar3) {
                    lVar4 = (ulong)(share == Shared) * 4 + 0x50;
                  }
                  else {
                    expected_08._M_str = "cont";
                    expected_08._M_len = 4;
                    bVar3 = Lexer::takeKeyword(this,expected_08);
                    if (bVar3) {
                      lVar4 = (ulong)(share == Shared) * 4 + 0x18;
                    }
                    else {
                      expected_09._M_str = "none";
                      expected_09._M_len = 4;
                      bVar3 = Lexer::takeKeyword(this,expected_09);
                      if (bVar3) {
                        lVar4 = (ulong)(share == Shared) * 4 + 0x58;
                      }
                      else {
                        expected_10._M_str = "noextern";
                        expected_10._M_len = 8;
                        bVar3 = Lexer::takeKeyword(this,expected_10);
                        if (bVar3) {
                          lVar4 = (ulong)(share == Shared) * 4 + 0x60;
                        }
                        else {
                          expected_11._M_str = "nofunc";
                          expected_11._M_len = 6;
                          bVar3 = Lexer::takeKeyword(this,expected_11);
                          if (bVar3) {
                            lVar4 = (ulong)(share == Shared) * 4 + 0x68;
                          }
                          else {
                            expected_12._M_str = "noexn";
                            expected_12._M_len = 5;
                            bVar3 = Lexer::takeKeyword(this,expected_12);
                            if (bVar3) {
                              lVar4 = (ulong)(share == Shared) * 4 + 0x78;
                            }
                            else {
                              expected_13._M_str = "nocont";
                              expected_13._M_len = 6;
                              bVar3 = Lexer::takeKeyword(this,expected_13);
                              if (!bVar3) {
                                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_68,"expected abstract heap type","");
                                Lexer::err(&local_48,this,&local_68);
                                puVar1 = (undefined8 *)
                                         ((long)&(__return_storage_ptr__->val).
                                                 super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 .
                                                 super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 .
                                                 super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 .
                                                 super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 .
                                                 super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                 .
                                                 super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         + 0x10);
                                *(undefined8 **)
                                 &(__return_storage_ptr__->val).
                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                  .
                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                     = puVar1;
                                paVar2 = &local_48.msg.field_2;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_48.msg._M_dataplus._M_p == paVar2) {
                                  *puVar1 = CONCAT71(local_48.msg.field_2._M_allocated_capacity.
                                                     _1_7_,local_48.msg.field_2._M_local_buf[0]);
                                  *(undefined8 *)
                                   ((long)&(__return_storage_ptr__->val).
                                           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                           .
                                           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                           .
                                           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                   + 0x18) = local_48.msg.field_2._8_8_;
                                }
                                else {
                                  *(pointer *)
                                   &(__return_storage_ptr__->val).
                                    super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                    .
                                    super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                       = local_48.msg._M_dataplus._M_p;
                                  *(ulong *)((long)&(__return_storage_ptr__->val).
                                                                                                        
                                                  super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                                  .
                                                  super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                            + 0x10) =
                                       CONCAT71(local_48.msg.field_2._M_allocated_capacity._1_7_,
                                                local_48.msg.field_2._M_local_buf[0]);
                                }
                                *(size_type *)
                                 ((long)&(__return_storage_ptr__->val).
                                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 + 8) = local_48.msg._M_string_length;
                                local_48.msg._M_string_length = 0;
                                local_48.msg.field_2._M_local_buf[0] = '\0';
                                *(__index_type *)
                                 ((long)&(__return_storage_ptr__->val).
                                         super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                         .
                                         super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
                                 + 0x20) = '\x01';
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_68._M_dataplus._M_p == &local_68.field_2) {
                                  return __return_storage_ptr__;
                                }
                                local_48.msg._M_dataplus._M_p = (pointer)paVar2;
                                operator_delete(local_68._M_dataplus._M_p,
                                                local_68.field_2._M_allocated_capacity + 1);
                                return __return_storage_ptr__;
                              }
                              lVar4 = (ulong)(share == Shared) * 4 + 0x70;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  *(long *)&(__return_storage_ptr__->val).
            super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
            .
            super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
       = lVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
   + 8) = 0;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).
           super__Variant_base<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Move_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Copy_ctor_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
           .
           super__Variant_storage_alias<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT,_wasm::Err>
   + 0x20) = '\0';
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::HeapTypeT> absheaptype(Ctx& ctx, Shareability share) {
  if (ctx.in.takeKeyword("func"sv)) {
    return ctx.makeFuncType(share);
  }
  if (ctx.in.takeKeyword("any"sv)) {
    return ctx.makeAnyType(share);
  }
  if (ctx.in.takeKeyword("extern"sv)) {
    return ctx.makeExternType(share);
  }
  if (ctx.in.takeKeyword("eq"sv)) {
    return ctx.makeEqType(share);
  }
  if (ctx.in.takeKeyword("i31"sv)) {
    return ctx.makeI31Type(share);
  }
  if (ctx.in.takeKeyword("struct"sv)) {
    return ctx.makeStructType(share);
  }
  if (ctx.in.takeKeyword("array"sv)) {
    return ctx.makeArrayType(share);
  }
  if (ctx.in.takeKeyword("exn"sv)) {
    return ctx.makeExnType(share);
  }
  if (ctx.in.takeKeyword("string"sv)) {
    return ctx.makeStringType(share);
  }
  if (ctx.in.takeKeyword("cont"sv)) {
    return ctx.makeContType(share);
  }
  if (ctx.in.takeKeyword("none"sv)) {
    return ctx.makeNoneType(share);
  }
  if (ctx.in.takeKeyword("noextern"sv)) {
    return ctx.makeNoextType(share);
  }
  if (ctx.in.takeKeyword("nofunc"sv)) {
    return ctx.makeNofuncType(share);
  }
  if (ctx.in.takeKeyword("noexn"sv)) {
    return ctx.makeNoexnType(share);
  }
  if (ctx.in.takeKeyword("nocont"sv)) {
    return ctx.makeNocontType(share);
  }
  return ctx.in.err("expected abstract heap type");
}